

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_flags nk_edit_string(nk_context *ctx,nk_flags flags,char *memory,int *len,int max,
                       nk_plugin_filter filter)

{
  uint uVar1;
  nk_window *pnVar2;
  uchar uVar3;
  nk_flags nVar4;
  int iVar5;
  nk_size size;
  code *filter_00;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5a89,
                  "nk_flags nk_edit_string(struct nk_context *, nk_flags, char *, int *, int, nk_plugin_filter)"
                 );
  }
  if (memory != (char *)0x0) {
    if (len != (int *)0x0) {
      filter_00 = nk_filter_default;
      if (filter != (nk_plugin_filter)0x0) {
        filter_00 = filter;
      }
      pnVar2 = ctx->current;
      uVar1 = (pnVar2->edit).seq;
      (ctx->text_edit).undo.undo_point = 0;
      (ctx->text_edit).undo.redo_point = 99;
      (ctx->text_edit).undo.undo_char_point = 0;
      (ctx->text_edit).undo.redo_char_point = 999;
      (ctx->text_edit).cursor = 0;
      (ctx->text_edit).select_start = 0;
      (ctx->text_edit).select_end = 0;
      (ctx->text_edit).mode = '\0';
      (ctx->text_edit).cursor_at_end_of_line = '\0';
      (ctx->text_edit).initialized = '\x01';
      (ctx->text_edit).has_preferred_x = '\0';
      (ctx->text_edit).preferred_x = 0.0;
      (ctx->text_edit).single_line = (flags >> 10 & 1) == 0;
      (ctx->text_edit).filter = filter_00;
      (ctx->text_edit).scrollbar.x = 0.0;
      (ctx->text_edit).scrollbar.y = 0.0;
      if (((pnVar2->edit).active == 0) || (uVar1 != (pnVar2->edit).name)) {
        uVar3 = '\0';
      }
      else {
        if ((flags & 0x10) == 0) {
          iVar5 = (pnVar2->edit).cursor;
        }
        else {
          iVar5 = nk_utf_len(memory,*len);
        }
        (ctx->text_edit).cursor = iVar5;
        if ((flags & 0x20) == 0) {
          iVar5 = (pnVar2->edit).cursor;
          (ctx->text_edit).select_start = iVar5;
        }
        else {
          (ctx->text_edit).select_start = (pnVar2->edit).sel_start;
          iVar5 = (pnVar2->edit).sel_end;
        }
        (ctx->text_edit).select_end = iVar5;
        (ctx->text_edit).mode = (pnVar2->edit).mode;
        (ctx->text_edit).scrollbar.x = (float)(pnVar2->edit).scrollbar.x;
        (ctx->text_edit).scrollbar.y = (float)(pnVar2->edit).scrollbar.y;
        uVar3 = '\x01';
      }
      size = 1;
      if (1 < max) {
        size = (nk_size)(uint)max;
      }
      (ctx->text_edit).active = uVar3;
      iVar5 = (int)size + -1;
      if (*len < iVar5) {
        iVar5 = *len;
      }
      *len = iVar5;
      nk_buffer_init_fixed(&(ctx->text_edit).string.buffer,memory,size);
      (ctx->text_edit).string.len = 0;
      iVar5 = *len;
      (ctx->text_edit).string.buffer.allocated = (long)iVar5;
      iVar5 = nk_utf_len(memory,iVar5);
      (ctx->text_edit).string.len = iVar5;
      nVar4 = nk_edit_buffer(ctx,flags,&ctx->text_edit,filter_00);
      *len = (int)(ctx->text_edit).string.buffer.allocated;
      if ((ctx->text_edit).active != '\0') {
        (pnVar2->edit).cursor = (ctx->text_edit).cursor;
        (pnVar2->edit).sel_start = (ctx->text_edit).select_start;
        (pnVar2->edit).sel_end = (ctx->text_edit).select_end;
        (pnVar2->edit).mode = (ctx->text_edit).mode;
        (pnVar2->edit).scrollbar.x = (nk_uint)(long)(ctx->text_edit).scrollbar.x;
        (pnVar2->edit).scrollbar.y = (nk_uint)(long)(ctx->text_edit).scrollbar.y;
      }
      return nVar4;
    }
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5a8b,
                  "nk_flags nk_edit_string(struct nk_context *, nk_flags, char *, int *, int, nk_plugin_filter)"
                 );
  }
  __assert_fail("memory",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x5a8a,
                "nk_flags nk_edit_string(struct nk_context *, nk_flags, char *, int *, int, nk_plugin_filter)"
               );
}

Assistant:

NK_API nk_flags
nk_edit_string(struct nk_context *ctx, nk_flags flags,
    char *memory, int *len, int max, nk_plugin_filter filter)
{
    nk_hash hash;
    nk_flags state;
    struct nk_text_edit *edit;
    struct nk_window *win;

    NK_ASSERT(ctx);
    NK_ASSERT(memory);
    NK_ASSERT(len);
    if (!ctx || !memory || !len)
        return 0;

    filter = (!filter) ? nk_filter_default: filter;
    win = ctx->current;
    hash = win->edit.seq;
    edit = &ctx->text_edit;
    nk_textedit_clear_state(&ctx->text_edit, (flags & NK_EDIT_MULTILINE)?
        NK_TEXT_EDIT_MULTI_LINE: NK_TEXT_EDIT_SINGLE_LINE, filter);

    if (win->edit.active && hash == win->edit.name) {
        if (flags & NK_EDIT_NO_CURSOR)
            edit->cursor = nk_utf_len(memory, *len);
        else edit->cursor = win->edit.cursor;
        if (!(flags & NK_EDIT_SELECTABLE)) {
            edit->select_start = win->edit.cursor;
            edit->select_end = win->edit.cursor;
        } else {
            edit->select_start = win->edit.sel_start;
            edit->select_end = win->edit.sel_end;
        }
        edit->mode = win->edit.mode;
        edit->scrollbar.x = (float)win->edit.scrollbar.x;
        edit->scrollbar.y = (float)win->edit.scrollbar.y;
        edit->active = nk_true;
    } else edit->active = nk_false;

    max = NK_MAX(1, max);
    *len = NK_MIN(*len, max-1);
    nk_str_init_fixed(&edit->string, memory, (nk_size)max);
    edit->string.buffer.allocated = (nk_size)*len;
    edit->string.len = nk_utf_len(memory, *len);
    state = nk_edit_buffer(ctx, flags, edit, filter);
    *len = (int)edit->string.buffer.allocated;

    if (edit->active) {
        win->edit.cursor = edit->cursor;
        win->edit.sel_start = edit->select_start;
        win->edit.sel_end = edit->select_end;
        win->edit.mode = edit->mode;
        win->edit.scrollbar.x = (nk_uint)edit->scrollbar.x;
        win->edit.scrollbar.y = (nk_uint)edit->scrollbar.y;
    } return state;
}